

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stat_aggregator.cc
# Opt level: O0

void __thiscall
StatAggregator::aggregateAndPrintStats(StatAggregator *this,char *title,int count,char *unit)

{
  char *in_RCX;
  uint in_EDX;
  undefined8 in_RSI;
  long *in_RDI;
  int printed;
  int j;
  int i;
  samples_t all_timings;
  string *in_stack_00000220;
  samples_t *in_stack_00000228;
  StatAggregator *in_stack_00000230;
  value_type *in_stack_fffffffffffffee8;
  StatAggregator *in_stack_fffffffffffffef0;
  StatAggregator *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef8;
  iterator in_stack_ffffffffffffff00;
  undefined1 local_e9 [25];
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff30;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_ffffffffffffff38;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_ffffffffffffff40;
  const_iterator in_stack_ffffffffffffff48;
  undefined4 local_ac;
  long local_a8;
  unsigned_long *local_78;
  unsigned_long *local_60;
  unsigned_long *local_58;
  unsigned_long *local_50;
  int local_40;
  int local_3c;
  char *local_20;
  uint local_14;
  undefined8 local_10;
  
  local_20 = in_RCX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_>
            *)0x181e90);
  for (local_3c = 0; local_3c < (int)in_RDI[1]; local_3c = local_3c + 1) {
    for (local_40 = 1; local_40 < *(int *)((long)in_RDI + 0xc); local_40 = local_40 + 1) {
      in_stack_fffffffffffffef8 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (*(long *)(*in_RDI + (long)local_3c * 8) + 0x20);
      local_50 = (unsigned_long *)
                 std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                            in_stack_fffffffffffffee8);
      __gnu_cxx::
      __normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>
      ::__normal_iterator<unsigned_long*>
                ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  *)in_stack_fffffffffffffef0,
                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  *)in_stack_fffffffffffffee8);
      local_58 = (unsigned_long *)
                 std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                            in_stack_fffffffffffffee8);
      local_60 = (unsigned_long *)
                 std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                            in_stack_fffffffffffffee8);
      in_stack_ffffffffffffff00 =
           std::vector<unsigned_long,std::allocator<unsigned_long>>::
           insert<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,void>
                     (in_stack_ffffffffffffff30,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                      in_stack_ffffffffffffff38);
      local_78 = in_stack_ffffffffffffff00._M_current;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x181fd8);
    }
    local_a8 = *(long *)(*in_RDI + (long)local_3c * 8) + 0x20;
    std::make_pair<std::__cxx11::string&,std::vector<unsigned_long,std::allocator<unsigned_long>>*>
              (in_stack_fffffffffffffef8,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> **)in_stack_fffffffffffffef0);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_>
    ::push_back((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_>
                 *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>
             *)0x182056);
  }
  local_ac = 0;
  printf("\n===== Avg Latencies (%s) - %d samples (%s) %n",local_10,(ulong)local_14,local_20,
         &local_ac);
  fillLineWith(in_stack_fffffffffffffef0,(char)((ulong)in_stack_fffffffffffffee8 >> 0x38),
               (int)in_stack_fffffffffffffee8);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_>
            *)in_stack_ffffffffffffff40._M_current,
           (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_>
            *)in_stack_ffffffffffffff38._M_current);
  this_00 = (StatAggregator *)local_e9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_e9 + 1),local_20,(allocator *)this_00);
  printValues(in_stack_00000230,in_stack_00000228,in_stack_00000220);
  std::__cxx11::string::~string((string *)(local_e9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_e9);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_>
             *)in_stack_ffffffffffffff00._M_current);
  fillLineWith(this_00,(char)((ulong)local_20 >> 0x38),(int)local_20);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_>
             *)in_stack_ffffffffffffff00._M_current);
  return;
}

Assistant:

void StatAggregator::aggregateAndPrintStats(const char* title, int count,
                                            const char* unit) {

    samples_t all_timings;
    for (int i = 0; i < num_stats; ++i) {
        for (int j = 1; j < num_samples; ++j) {
            t_stats[i][0].latencies.insert(t_stats[i][0].latencies.end(),
                                           t_stats[i][j].latencies.begin(),
                                           t_stats[i][j].latencies.end());
            t_stats[i][j].latencies.clear();
        }

        all_timings.push_back(std::make_pair(t_stats[i][0].name,
                                             &t_stats[i][0].latencies));
    }

    int printed = 0;
    printf("\n===== Avg Latencies (%s) - %d samples (%s) %n",
            title, count, unit, &printed);
    fillLineWith('=', 88-printed);

    printValues(all_timings, unit);

    fillLineWith('=', 87);
}